

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

void crnd::crnd_trace(char *pFmt,__va_list_tag *args)

{
  return;
}

Assistant:

void crnd_trace(const char* pFmt, va_list args)
    {
        if (crnd_is_debugger_present())
        {
            char buf[512];
#if defined(WIN32) && defined(_MSC_VER)
            vsprintf_s(buf, sizeof(buf), pFmt, args);
#else
    vsprintf(buf, pFmt, args);
#endif

            crnd_output_debug_string(buf);
        }
    }